

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginMenu(char *label,bool enabled)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiID IVar3;
  ImGuiWindow *this;
  ImGuiWindow *pIVar4;
  ImGuiPopupRef *pIVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  ImGuiID id;
  ImGuiID IVar14;
  byte bVar15;
  undefined1 auVar16 [8];
  char *str_id;
  bool bVar17;
  float fVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ImVec2 ta;
  ImVec2 local_a0;
  ImVec2 local_98;
  undefined8 uStack_90;
  char *local_88;
  float local_7c;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  ImGuiWindow *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  uStack_70 = local_78;
  this = GImGui->CurrentWindow;
  this->Accessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  bVar17 = false;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  IVar6 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar18 = IVar6.x;
  local_78._4_4_ = IVar6.y;
  iVar2 = (GImGui->CurrentPopupStack).Size;
  if (iVar2 < (GImGui->OpenPopupStack).Size) {
    bVar17 = (GImGui->OpenPopupStack).Data[iVar2].PopupId == id;
  }
  local_48 = pIVar7->FocusedWindow;
  if (((this->Flags & 0x2000000) == 0) &&
     (iVar2 = (pIVar7->CurrentPopupStack).Size, iVar2 < (pIVar7->OpenPopupStack).Size)) {
    IVar3 = (pIVar7->OpenPopupStack).Data[iVar2].ParentMenuSet;
    auVar16 = (undefined1  [8])0x0;
    uStack_70._0_4_ = extraout_XMM0_Dc;
    local_78._0_4_ = IVar6.x;
    local_78._4_4_ = IVar6.y;
    uStack_70._4_4_ = extraout_XMM0_Dd;
    IVar14 = ImGuiWindow::GetID(this,"##menus",(char *)0x0);
    uVar9 = uStack_70;
    fVar18 = (float)local_78._0_4_;
    uVar19 = (undefined4)uStack_70;
    uVar20 = uStack_70._4_4_;
    if (IVar3 == IVar14) {
      pIVar7->FocusedWindow = this;
      auVar16 = (undefined1  [8])0x1;
    }
  }
  else {
    auVar16 = (undefined1  [8])0x0;
    uVar19 = extraout_XMM0_Dc;
    uVar20 = extraout_XMM0_Dd;
    uVar9 = uStack_70;
  }
  uStack_70 = uVar9;
  IVar6 = (this->DC).CursorPos;
  fStack_64 = IVar6.y;
  local_88 = label;
  fStack_60 = fStack_64;
  fStack_5c = fStack_64;
  if ((this->DC).LayoutType == 1) {
    local_78._0_4_ = fVar18;
    uStack_70._0_4_ = uVar19;
    uStack_70._4_4_ = uVar20;
    local_58._0_4_ = 0.0;
    if ((this->Flags & 0x400) != 0) {
      fVar18 = (GImGui->Style).FramePadding.y;
      local_58._0_4_ = fVar18 + fVar18 + GImGui->FontBaseSize * this->FontWindowScale;
    }
    local_68 = fStack_64 - (pIVar7->Style).FramePadding.y;
    local_98.x = IVar6.x - (this->WindowPadding).x;
    (this->DC).CursorPos.x = (float)(int)((pIVar7->Style).ItemSpacing.x * 0.5) + IVar6.x;
    IVar6 = (pIVar7->Style).ItemSpacing;
    fVar18 = IVar6.x;
    fVar21 = IVar6.y;
    local_a0.y = fVar21 + fVar21;
    local_a0.x = fVar18 + fVar18;
    PushStyleVar(7,&local_a0);
    local_a0.y = 0.0;
    local_a0.x = (float)local_78._0_4_;
    bVar10 = Selectable(local_88,bVar17,(uint)!enabled << 5 | 9,&local_a0);
    PopStyleVar(1);
    pIVar8 = GImGui;
    pIVar4 = GImGui->CurrentWindow;
    pIVar4->Accessed = true;
    if (pIVar4->SkipItems == false) {
      (pIVar4->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x;
      (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
      (pIVar4->DC).CurrentLineHeight = (pIVar4->DC).PrevLineHeight;
      (pIVar4->DC).CurrentLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
    }
    local_68 = local_68 + (float)local_58._0_4_;
    (this->DC).CursorPos.x =
         (float)(int)((pIVar7->Style).ItemSpacing.x * 0.5) + (this->DC).CursorPos.x;
    if (enabled) {
LAB_00149848:
      bVar11 = IsHovered(&(this->DC).LastItemRect,id,false);
    }
    else {
      bVar11 = false;
    }
  }
  else {
    uStack_90 = 0;
    local_78 = auVar16;
    local_68 = fStack_64 - (pIVar7->Style).WindowPadding.y;
    local_98 = IVar6;
    local_7c = ImGuiSimpleColumns::DeclColumns
                         (&this->MenuColumns,fVar18,0.0,(float)(int)(pIVar7->FontSize * 1.2));
    IVar6 = GetContentRegionAvail();
    fVar18 = IVar6.x - local_7c;
    local_58 = ZEXT416(~-(uint)(fVar18 <= 0.0) & (uint)fVar18);
    local_a0.y = 0.0;
    local_a0.x = local_7c;
    bVar10 = Selectable(label,bVar17,(uint)!enabled << 5 | 0x49,&local_a0);
    if (enabled) {
      IVar6.y = local_98.y + 0.0;
      IVar6.x = pIVar7->FontSize * 0.2 + (float)local_58._0_4_ + (this->MenuColumns).Pos[2] +
                local_98.x;
      RenderCollapseTriangle(IVar6,false,1.0,false);
      auVar16 = local_78;
      goto LAB_00149848;
    }
    bVar11 = false;
    PushStyleColor(0,(pIVar7->Style).Colors + 1);
    IVar1.y = local_98.y + 0.0;
    IVar1.x = pIVar7->FontSize * 0.2 + (float)local_58._0_4_ + (this->MenuColumns).Pos[2] +
              local_98.x;
    RenderCollapseTriangle(IVar1,false,1.0,false);
    PopStyleColor(1);
    auVar16 = local_78;
  }
  bVar12 = SUB81(auVar16,0);
  if (bVar12 != 0) {
    pIVar7->FocusedWindow = local_48;
  }
  if ((this->Flags & 0xa000000) == 0) {
    if ((bVar12 & bVar17 & bVar10) == 0) {
      if ((bVar10 == false) && ((bVar12 & bVar11) != 1 || bVar17 != false)) {
        bVar12 = 0;
      }
      else {
        bVar12 = 1;
      }
      bVar15 = 0;
      goto LAB_00149976;
    }
    bVar12 = 0;
    bVar17 = false;
  }
  else {
    if (pIVar7->HoveredWindow == this) {
      iVar2 = (pIVar7->CurrentPopupStack).Size;
      if (((iVar2 < (pIVar7->OpenPopupStack).Size) &&
          (pIVar5 = (pIVar7->OpenPopupStack).Data, pIVar5[iVar2].ParentWindow == this)) &&
         (pIVar4 = pIVar5[iVar2].Window, pIVar4 != (ImGuiWindow *)0x0)) {
        local_38.x = (pIVar4->Pos).x;
        fVar18 = (pIVar4->Pos).y;
        IVar6 = (pIVar7->IO).MousePos;
        IVar1 = (pIVar7->IO).MouseDelta;
        fVar21 = IVar6.x - IVar1.x;
        local_a0.y = IVar6.y - IVar1.y;
        if (local_38.x < (this->Pos).x || local_38.x == (this->Pos).x) {
          local_38.x = local_38.x + (pIVar4->Size).x;
          fVar24 = 0.5;
        }
        else {
          fVar24 = -0.5;
        }
        fVar22 = ABS(fVar21 - local_38.x) * 0.3;
        fVar23 = 30.0;
        if (fVar22 <= 30.0) {
          fVar23 = fVar22;
        }
        fVar23 = (float)(-(uint)(fVar22 < 5.0) & 0x40a00000 | ~-(uint)(fVar22 < 5.0) & (uint)fVar23)
        ;
        local_a0.x = fVar24 + fVar21;
        fVar21 = (fVar18 - fVar23) - local_a0.y;
        if (fVar21 <= -100.0) {
          fVar21 = -100.0;
        }
        local_38.y = fVar21 + local_a0.y;
        fVar18 = ((pIVar4->Size).y + fVar18 + fVar23) - local_a0.y;
        if (100.0 <= fVar18) {
          fVar18 = 100.0;
        }
        local_40.y = fVar18 + local_a0.y;
        local_40.x = local_38.x;
        bVar13 = ImIsPointInTriangle(&(pIVar7->IO).MousePos,&local_a0,&local_38,&local_40);
      }
      else {
        bVar13 = false;
      }
      if (bVar17 != true || bVar11 != false) goto LAB_0014993b;
      bVar15 = (bVar13 ^ 1U) & pIVar7->HoveredIdPreviousFrame != 0 &
               pIVar7->HoveredIdPreviousFrame != id;
    }
    else {
      bVar13 = false;
LAB_0014993b:
      bVar15 = 0;
    }
    bVar12 = (bVar13 | bVar17 | bVar11 ^ 1U) ^ 1;
    if (bVar17 == false) {
      bVar12 = bVar10 & bVar11 | bVar12;
    }
LAB_00149976:
    if ((enabled) && (str_id = local_88, bVar15 == 0)) goto LAB_001499b4;
  }
  str_id = local_88;
  iVar2 = (GImGui->CurrentPopupStack).Size;
  if ((iVar2 < (GImGui->OpenPopupStack).Size) &&
     ((GImGui->OpenPopupStack).Data[iVar2].PopupId == id)) {
    ClosePopupToLevel(iVar2);
  }
LAB_001499b4:
  if (((bVar17 == false) && (bVar12 != 0)) &&
     ((pIVar7->CurrentPopupStack).Size < (pIVar7->OpenPopupStack).Size)) {
    OpenPopupEx(str_id,false);
    return false;
  }
  if (bVar12 == 0) {
    if (bVar17 == false) {
      return false;
    }
  }
  else {
    OpenPopupEx(str_id,false);
  }
  pIVar7 = GImGui;
  (GImGui->SetNextWindowPosVal).x = local_98.x;
  (pIVar7->SetNextWindowPosVal).y = local_68;
  pIVar7->SetNextWindowPosCond = 1;
  bVar17 = BeginPopupEx(str_id,(uint)((this->Flags & 0xa000000U) != 0) << 0x14 | 0x8000080);
  return bVar17;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImGuiWindow* backed_focused_window = g.FocusedWindow;

    bool pressed;
    bool menu_is_open = IsPopupOpen(id);
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].ParentMenuSet == window->GetID("##menus"));
    if (menuset_is_open)
        g.FocusedWindow = window;

    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        popup_pos = ImVec2(pos.x - window->WindowPadding.x, pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, style.ItemSpacing * 2.0f);
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_Menu | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        SameLine();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
    }
    else
    {
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float w = window->MenuColumns.DeclColumns(label_size.x, 0.0f, (float)(int)(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_Menu | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_DrawFillAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        if (!enabled) PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
        RenderCollapseTriangle(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.20f, 0.0f), false);
        if (!enabled) PopStyleColor();
    }

    bool hovered = enabled && IsHovered(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.FocusedWindow = backed_focused_window;

    bool want_open = false, want_close = false;
    if (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_within_opened_triangle = false;
        if (g.HoveredWindow == window && g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].ParentWindow == window)
        {
            if (ImGuiWindow* next_window = g.OpenPopupStack[g.CurrentPopupStack.Size].Window)
            {
                ImRect next_window_rect = next_window->Rect();
                ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
                ImVec2 tb = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
                ImVec2 tc = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
                float extra = ImClamp(fabsf(ta.x - tb.x) * 0.30f, 5.0f, 30.0f); // add a bit of extra slack.
                ta.x += (window->Pos.x < next_window->Pos.x) ? -0.5f : +0.5f;   // to avoid numerical issues
                tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);            // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
                tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
                moving_within_opened_triangle = ImIsPointInTriangle(g.IO.MousePos, ta, tb, tc);
                //window->DrawList->PushClipRectFullScreen(); window->DrawList->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? 0x80008000 : 0x80000080); window->DrawList->PopClipRect(); // Debug
            }
        }

        want_close = (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_within_opened_triangle);
        want_open = (!menu_is_open && hovered && !moving_within_opened_triangle) || (!menu_is_open && hovered && pressed);
    }
    else if (menu_is_open && pressed && menuset_is_open) // menu-bar: click open menu to close
    {
        want_close = true;
        want_open = menu_is_open = false;
    }
    else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // menu-bar: first click to open, then hover to open others
        want_open = true;
    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(GImGui->CurrentPopupStack.Size);

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.CurrentPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiSetCond_Always);
        ImGuiWindowFlags flags = ImGuiWindowFlags_ShowBorders | ((window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu)) ? ImGuiWindowFlags_ChildMenu|ImGuiWindowFlags_ChildWindow : ImGuiWindowFlags_ChildMenu);
        menu_is_open = BeginPopupEx(label, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }

    return menu_is_open;
}